

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_initialize(void)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  sqlite3_mutex *psVar5;
  void *p;
  
  if (sqlite3Config.isInit != 0) {
    return 0;
  }
  iVar3 = sqlite3MutexInit();
  if (iVar3 != 0) {
    return iVar3;
  }
  bVar2 = true;
  if ((sqlite3Config.bCoreMutex == '\0') ||
     (psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar5 == (sqlite3_mutex *)0x0)) {
    psVar5 = (sqlite3_mutex *)0x0;
  }
  else {
    (*sqlite3Config.mutex.xMutexEnter)(psVar5);
    bVar2 = false;
  }
  sqlite3Config.isMutexInit = 1;
  if (sqlite3Config.isMallocInit == 0) {
    if (sqlite3Config.m.xMalloc == (_func_void_ptr_int *)0x0) {
      sqlite3_config(4);
    }
    if (sqlite3Config.bCoreMutex == '\0') {
      mem0.mutex = (sqlite3_mutex *)0x0;
    }
    else {
      mem0.mutex = (*sqlite3Config.mutex.xMutexAlloc)(3);
    }
    if (((sqlite3Config.pPage == (void *)0x0) || (sqlite3Config.szPage < 0x200)) ||
       (sqlite3Config.nPage < 1)) {
      sqlite3Config.pPage = (void *)0x0;
      sqlite3Config.szPage = 0;
    }
    iVar3 = (*sqlite3Config.m.xInit)(sqlite3Config.m.pAppData);
    if (iVar3 == 0) goto LAB_0011b959;
    mem0.hardLimit = 0;
    mem0.nearlyFull = 0;
    mem0._28_4_ = 0;
    mem0.mutex = (sqlite3_mutex *)0x0;
    mem0.alarmThreshold = 0;
LAB_0011ba51:
    bVar1 = false;
  }
  else {
LAB_0011b959:
    sqlite3Config.isMallocInit = 1;
    if (sqlite3Config.pInitMutex == (sqlite3_mutex *)0x0) {
      if (sqlite3Config.bCoreMutex == '\0') {
        sqlite3Config.pInitMutex = (sqlite3_mutex *)0x0;
      }
      else {
        sqlite3Config.pInitMutex = (*sqlite3Config.mutex.xMutexAlloc)(1);
        if (sqlite3Config.pInitMutex == (sqlite3_mutex *)0x0 && sqlite3Config.bCoreMutex != '\0') {
          iVar3 = 7;
          goto LAB_0011ba51;
        }
      }
    }
    sqlite3Config.nRefInitMutex = sqlite3Config.nRefInitMutex + 1;
    iVar3 = 0;
    bVar1 = true;
  }
  if (!bVar2) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar5);
  }
  if (bVar1) {
    if (sqlite3Config.pInitMutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(sqlite3Config.pInitMutex);
    }
    iVar3 = 0;
    if (sqlite3Config.inProgress == 0 && sqlite3Config.isInit == 0) {
      sqlite3Config.inProgress = 1;
      memset(&sqlite3BuiltinFunctions,0,0xb8);
      sqlite3InsertBuiltinFuncs((FuncDef *)sqlite3AlterFunctions_aAlterTableFuncs,5);
      sqlite3InsertBuiltinFuncs((FuncDef *)sqlite3WindowFunctions_aWindowFuncs,0xf);
      sqlite3InsertBuiltinFuncs((FuncDef *)sqlite3RegisterDateTimeFunctions_aDateTimeFuncs,10);
      sqlite3InsertBuiltinFuncs((FuncDef *)sqlite3RegisterJsonFunctions_aJsonFunc,0x14);
      sqlite3InsertBuiltinFuncs((FuncDef *)sqlite3RegisterBuiltinFunctions_aBuiltinFunc,0x48);
      if ((sqlite3Config.isPCacheInit != 0) || (iVar3 = sqlite3PcacheInitialize(), iVar3 == 0)) {
        sqlite3Config.isPCacheInit = 1;
        iVar4 = sqlite3_initialize();
        iVar3 = 7;
        if ((iVar4 == 0) && (p = sqlite3Malloc(10), p != (void *)0x0)) {
          sqlite3_free(p);
          sqlite3_os_init();
          iVar3 = sqlite3MemdbInit();
          if (iVar3 == 0) {
            sqlite3PCacheBufferSetup(sqlite3Config.pPage,sqlite3Config.szPage,sqlite3Config.nPage);
            sqlite3Config.isInit = 1;
            iVar3 = 0;
          }
        }
      }
      sqlite3Config.inProgress = 0;
    }
    if (sqlite3Config.pInitMutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(sqlite3Config.pInitMutex);
    }
    if (!bVar2) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar5);
    }
    iVar4 = sqlite3Config.nRefInitMutex + -1;
    bVar1 = sqlite3Config.nRefInitMutex < 2;
    sqlite3Config.nRefInitMutex = iVar4;
    if (bVar1) {
      if (sqlite3Config.pInitMutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexFree)(sqlite3Config.pInitMutex);
      }
      sqlite3Config.pInitMutex = (sqlite3_mutex *)0x0;
    }
    if (!bVar2) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar5);
    }
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_initialize(void){
  MUTEX_LOGIC( sqlite3_mutex *pMainMtx; )      /* The main static mutex */
  int rc;                                      /* Result code */
#ifdef SQLITE_EXTRA_INIT
  int bRunExtraInit = 0;                       /* Extra initialization needed */
#endif

#ifdef SQLITE_OMIT_WSD
  rc = sqlite3_wsd_init(4096, 24);
  if( rc!=SQLITE_OK ){
    return rc;
  }
#endif

  /* If the following assert() fails on some obscure processor/compiler
  ** combination, the work-around is to set the correct pointer
  ** size at compile-time using -DSQLITE_PTRSIZE=n compile-time option */
  assert( SQLITE_PTRSIZE==sizeof(char*) );

  /* If SQLite is already completely initialized, then this call
  ** to sqlite3_initialize() should be a no-op.  But the initialization
  ** must be complete.  So isInit must not be set until the very end
  ** of this routine.
  */
  if( sqlite3GlobalConfig.isInit ){
    sqlite3MemoryBarrier();
    return SQLITE_OK;
  }

  /* Make sure the mutex subsystem is initialized.  If unable to
  ** initialize the mutex subsystem, return early with the error.
  ** If the system is so sick that we are unable to allocate a mutex,
  ** there is not much SQLite is going to be able to do.
  **
  ** The mutex subsystem must take care of serializing its own
  ** initialization.
  */
  rc = sqlite3MutexInit();
  if( rc ) return rc;

  /* Initialize the malloc() system and the recursive pInitMutex mutex.
  ** This operation is protected by the STATIC_MAIN mutex.  Note that
  ** MutexAlloc() is called for a static mutex prior to initializing the
  ** malloc subsystem - this implies that the allocation of a static
  ** mutex must not require support from the malloc subsystem.
  */
  MUTEX_LOGIC( pMainMtx = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MAIN); )
  sqlite3_mutex_enter(pMainMtx);
  sqlite3GlobalConfig.isMutexInit = 1;
  if( !sqlite3GlobalConfig.isMallocInit ){
    rc = sqlite3MallocInit();
  }
  if( rc==SQLITE_OK ){
    sqlite3GlobalConfig.isMallocInit = 1;
    if( !sqlite3GlobalConfig.pInitMutex ){
      sqlite3GlobalConfig.pInitMutex =
           sqlite3MutexAlloc(SQLITE_MUTEX_RECURSIVE);
      if( sqlite3GlobalConfig.bCoreMutex && !sqlite3GlobalConfig.pInitMutex ){
        rc = SQLITE_NOMEM_BKPT;
      }
    }
  }
  if( rc==SQLITE_OK ){
    sqlite3GlobalConfig.nRefInitMutex++;
  }
  sqlite3_mutex_leave(pMainMtx);

  /* If rc is not SQLITE_OK at this point, then either the malloc
  ** subsystem could not be initialized or the system failed to allocate
  ** the pInitMutex mutex. Return an error in either case.  */
  if( rc!=SQLITE_OK ){
    return rc;
  }

  /* Do the rest of the initialization under the recursive mutex so
  ** that we will be able to handle recursive calls into
  ** sqlite3_initialize().  The recursive calls normally come through
  ** sqlite3_os_init() when it invokes sqlite3_vfs_register(), but other
  ** recursive calls might also be possible.
  **
  ** IMPLEMENTATION-OF: R-00140-37445 SQLite automatically serializes calls
  ** to the xInit method, so the xInit method need not be threadsafe.
  **
  ** The following mutex is what serializes access to the appdef pcache xInit
  ** methods.  The sqlite3_pcache_methods.xInit() all is embedded in the
  ** call to sqlite3PcacheInitialize().
  */
  sqlite3_mutex_enter(sqlite3GlobalConfig.pInitMutex);
  if( sqlite3GlobalConfig.isInit==0 && sqlite3GlobalConfig.inProgress==0 ){
    sqlite3GlobalConfig.inProgress = 1;
#ifdef SQLITE_ENABLE_SQLLOG
    {
      extern void sqlite3_init_sqllog(void);
      sqlite3_init_sqllog();
    }
#endif
    memset(&sqlite3BuiltinFunctions, 0, sizeof(sqlite3BuiltinFunctions));
    sqlite3RegisterBuiltinFunctions();
    if( sqlite3GlobalConfig.isPCacheInit==0 ){
      rc = sqlite3PcacheInitialize();
    }
    if( rc==SQLITE_OK ){
      sqlite3GlobalConfig.isPCacheInit = 1;
      rc = sqlite3OsInit();
    }
#ifndef SQLITE_OMIT_DESERIALIZE
    if( rc==SQLITE_OK ){
      rc = sqlite3MemdbInit();
    }
#endif
    if( rc==SQLITE_OK ){
      sqlite3PCacheBufferSetup( sqlite3GlobalConfig.pPage,
          sqlite3GlobalConfig.szPage, sqlite3GlobalConfig.nPage);
      sqlite3MemoryBarrier();
      sqlite3GlobalConfig.isInit = 1;
#ifdef SQLITE_EXTRA_INIT
      bRunExtraInit = 1;
#endif
    }
    sqlite3GlobalConfig.inProgress = 0;
  }
  sqlite3_mutex_leave(sqlite3GlobalConfig.pInitMutex);

  /* Go back under the static mutex and clean up the recursive
  ** mutex to prevent a resource leak.
  */
  sqlite3_mutex_enter(pMainMtx);
  sqlite3GlobalConfig.nRefInitMutex--;
  if( sqlite3GlobalConfig.nRefInitMutex<=0 ){
    assert( sqlite3GlobalConfig.nRefInitMutex==0 );
    sqlite3_mutex_free(sqlite3GlobalConfig.pInitMutex);
    sqlite3GlobalConfig.pInitMutex = 0;
  }
  sqlite3_mutex_leave(pMainMtx);

  /* The following is just a sanity check to make sure SQLite has
  ** been compiled correctly.  It is important to run this code, but
  ** we don't want to run it too often and soak up CPU cycles for no
  ** reason.  So we run it once during initialization.
  */
#ifndef NDEBUG
#ifndef SQLITE_OMIT_FLOATING_POINT
  /* This section of code's only "output" is via assert() statements. */
  if( rc==SQLITE_OK ){
    u64 x = (((u64)1)<<63)-1;
    double y;
    assert(sizeof(x)==8);
    assert(sizeof(x)==sizeof(y));
    memcpy(&y, &x, 8);
    assert( sqlite3IsNaN(y) );
  }
#endif
#endif

  /* Do extra initialization steps requested by the SQLITE_EXTRA_INIT
  ** compile-time option.
  */
#ifdef SQLITE_EXTRA_INIT
  if( bRunExtraInit ){
    int SQLITE_EXTRA_INIT(const char*);
    rc = SQLITE_EXTRA_INIT(0);
  }
#endif

  return rc;
}